

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::modelToString_abi_cxx11_(Args *this,model_name mn)

{
  int in_EDX;
  string *in_RDI;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"cbow",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_EDX == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"sg",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_EDX == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"sup",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unknown model name!",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  return in_RDI;
}

Assistant:

std::string Args::modelToString(model_name mn) const {
  switch (mn) {
    case model_name::cbow:
      return "cbow";
    case model_name::sg:
      return "sg";
    case model_name::sup:
      return "sup";
  }
  return "Unknown model name!"; // should never happen
}